

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_dense.c
# Opt level: O0

int SUNLinSolSolve_Dense(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype tol)

{
  undefined8 uVar1;
  sunrealtype **ppsVar2;
  undefined8 uVar3;
  sunindextype sVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  SUNMatrix in_RSI;
  long *in_RDI;
  sunindextype *pivots;
  sunrealtype *xdata;
  sunrealtype **A_cols;
  SUNContext sunctx_local_scope_;
  
  N_VScale(0x3ff0000000000000,in_RCX,in_RDX);
  ppsVar2 = SUNDenseMatrix_Cols(in_RSI);
  uVar3 = N_VGetArrayPointer(in_RDX);
  uVar1 = *(undefined8 *)(*in_RDI + 8);
  sVar4 = SUNDenseMatrix_Rows(in_RSI);
  SUNDlsMat_denseGETRS(ppsVar2,sVar4,uVar1,uVar3);
  *(undefined8 *)(*in_RDI + 0x10) = 0;
  return 0;
}

Assistant:

int SUNLinSolSolve_Dense(SUNLinearSolver S, SUNMatrix A, N_Vector x, N_Vector b,
                         SUNDIALS_MAYBE_UNUSED sunrealtype tol)
{
  SUNFunctionBegin(S->sunctx);
  sunrealtype **A_cols, *xdata;
  sunindextype* pivots;

  /* copy b into x */
  N_VScale(ONE, b, x);
  SUNCheckLastErr();

  /* access data pointers (return with failure on NULL) */
  A_cols = NULL;
  xdata  = NULL;
  pivots = NULL;
  A_cols = SUNDenseMatrix_Cols(A);
  SUNCheckLastErr();
  xdata = N_VGetArrayPointer(x);
  SUNCheckLastErr();
  pivots = PIVOTS(S);

  SUNAssert(A_cols, SUN_ERR_ARG_CORRUPT);
  SUNAssert(xdata, SUN_ERR_ARG_CORRUPT);
  SUNAssert(pivots, SUN_ERR_ARG_CORRUPT);

  /* solve using LU factors */
  SUNDlsMat_denseGETRS(A_cols, SUNDenseMatrix_Rows(A), pivots, xdata);
  LASTFLAG(S) = SUN_SUCCESS;
  return SUN_SUCCESS;
}